

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int experimental_arenas_create_ext_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ulong uVar1;
  int iVar2;
  size_t __n;
  uint arena_ind;
  arena_config_t config;
  
  malloc_mutex_lock((tsdn_t *)tsd,&ctl_mtx);
  config.extent_hooks = &duckdb_je_ehooks_default_extent_hooks;
  config.metadata_use_hooks = true;
  config._9_7_ = 0;
  if (oldlenp == (size_t *)0x0 || oldp == (void *)0x0) {
    if (oldlenp != (size_t *)0x0) goto LAB_01e8f084;
  }
  else {
    if (*oldlenp == 4) {
      iVar2 = 0x16;
      if (newp != (void *)0x0) {
        if (newlen != 0x10) goto LAB_01e8f08b;
        config.extent_hooks = *newp;
        config._8_8_ = *(undefined8 *)((long)newp + 8);
      }
      arena_ind = ctl_arena_init(tsd,&config);
      if (arena_ind == 0xffffffff) {
        iVar2 = 0xb;
      }
      else {
        uVar1 = *oldlenp;
        if (uVar1 == 4) {
          *(uint *)oldp = arena_ind;
          iVar2 = 0;
        }
        else {
          __n = 4;
          if (uVar1 < 4) {
            __n = uVar1;
          }
          switchD_0193dc74::default(oldp,&arena_ind,__n);
          *oldlenp = __n;
        }
      }
      goto LAB_01e8f08b;
    }
LAB_01e8f084:
    *oldlenp = 0;
  }
  iVar2 = 0x16;
LAB_01e8f08b:
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  return iVar2;
}

Assistant:

static int
experimental_arenas_create_ext_ctl(tsd_t *tsd,
    const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned arena_ind;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);

	arena_config_t config = arena_config_default;
	VERIFY_READ(unsigned);
	WRITE(config, arena_config_t);

	if ((arena_ind = ctl_arena_init(tsd, &config)) == UINT_MAX) {
		ret = EAGAIN;
		goto label_return;
	}
	READ(arena_ind, unsigned);
	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}